

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
ForkHub<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
::destroy(ForkHub<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
          *this)

{
  PromiseBase node;
  PromiseArenaMember *pPVar1;
  
  if ((this->result).value.ptr.isSet == true) {
    node.node.ptr =
         (this->result).value.ptr.field_1.value.impl.
         super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
         .value.super_PromiseBase.node;
    if (node.node.ptr != (PromiseNode *)0x0) {
      (this->result).value.ptr.field_1.value.impl.
      super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
      .value.super_PromiseBase.node = (OwnPromiseNode)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
    }
    pPVar1 = &((this->result).value.ptr.field_1.value.impl.
               super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
               super_PromiseBase.node.ptr)->super_PromiseArenaMember;
    if (pPVar1 != (PromiseArenaMember *)0x0) {
      (this->result).value.ptr.field_1.value.impl.
      super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      PromiseDisposer::dispose(pPVar1);
    }
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  (this->super_ForkHubBase).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_006dcf58;
  (this->super_ForkHubBase).super_Event._vptr_Event = (_func_int **)&DAT_006dcf80;
  pPVar1 = &((this->super_ForkHubBase).inner.ptr)->super_PromiseArenaMember;
  if (pPVar1 != (PromiseArenaMember *)0x0) {
    (this->super_ForkHubBase).inner.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(pPVar1);
  }
  Event::~Event(&(this->super_ForkHubBase).super_Event);
  return;
}

Assistant:

void destroy() override { freePromise(this); }